

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O3

void duckdb::PhysicalLimit::SetInitialLimits
               (BoundLimitNode *limit_val,BoundLimitNode *offset_val,optional_idx *limit,
               optional_idx *offset)

{
  idx_t in_RAX;
  idx_t iVar1;
  optional_idx oVar2;
  optional_idx local_28;
  
  local_28.index = in_RAX;
  if (limit_val->type == UNSET) {
    oVar2.index = 0x4000000000000000;
  }
  else {
    if (limit_val->type != CONSTANT_VALUE) goto LAB_01530ee1;
    iVar1 = BoundLimitNode::GetConstantValue(limit_val);
    optional_idx::optional_idx(&local_28,iVar1);
    oVar2.index = local_28.index;
  }
  limit->index = (idx_t)oVar2;
LAB_01530ee1:
  if (offset_val->type == UNSET) {
    offset->index = 0;
  }
  else if (offset_val->type == CONSTANT_VALUE) {
    iVar1 = BoundLimitNode::GetConstantValue(offset_val);
    optional_idx::optional_idx(&local_28,iVar1);
    offset->index = (idx_t)local_28;
  }
  return;
}

Assistant:

void PhysicalLimit::SetInitialLimits(const BoundLimitNode &limit_val, const BoundLimitNode &offset_val,
                                     optional_idx &limit, optional_idx &offset) {
	switch (limit_val.Type()) {
	case LimitNodeType::CONSTANT_VALUE:
		limit = limit_val.GetConstantValue();
		break;
	case LimitNodeType::UNSET:
		limit = MAX_LIMIT_VALUE;
		break;
	default:
		break;
	}
	switch (offset_val.Type()) {
	case LimitNodeType::CONSTANT_VALUE:
		offset = offset_val.GetConstantValue();
		break;
	case LimitNodeType::UNSET:
		offset = 0;
		break;
	default:
		break;
	}
}